

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.cpp
# Opt level: O2

SubpassAttachmentHandle __thiscall
myvk::RenderPassState::SubpassAttachmentHandle::AddInputAttachment
          (SubpassAttachmentHandle *this,char *attachment_str,VkImageLayout layout,
          char *generator_subpass_str,VkPipelineStageFlags generator_stage,
          VkPipelineStageFlags use_stage,VkAccessFlags generator_access,VkAccessFlags use_access,
          VkDependencyFlags dependency_flag)

{
  long lVar1;
  RenderPassState *this_00;
  long lVar2;
  pointer pVVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  uint32_t src_subpass;
  long lVar6;
  vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> *this_01;
  SubpassAttachmentHandle SVar7;
  VkAttachmentReference local_38;
  
  lVar1 = *(long *)(this->m_state_ptr + 0x78) + (ulong)this->m_subpass * 0x50;
  this_01 = (vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> *)(lVar1 + 0x18);
  local_38.attachment = get_attachment(this->m_state_ptr,attachment_str);
  local_38.layout = layout;
  std::vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>::
  emplace_back<VkAttachmentReference>(this_01,&local_38);
  this_00 = this->m_state_ptr;
  lVar2 = *(long *)(this_00 + 0x90);
  lVar6 = (ulong)this->m_subpass * 0x48;
  pVVar3 = (this_01->
           super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(lVar2 + 0x10 + lVar6) = pVVar3;
  *(int *)(lVar2 + 8 + lVar6) = (int)((ulong)(*(long *)(lVar1 + 0x20) - (long)pVVar3) >> 3);
  src_subpass = get_subpass(this_00,generator_subpass_str);
  insert_subpass_dependency
            (this_00,src_subpass,this->m_subpass,generator_stage,use_stage,generator_access,
             use_access,dependency_flag);
  uVar4 = this->m_state_ptr;
  uVar5 = this->m_subpass;
  SVar7.m_subpass = uVar5;
  SVar7.m_state_ptr = (RenderPassState *)uVar4;
  SVar7._12_4_ = 0;
  return SVar7;
}

Assistant:

RenderPassState::SubpassAttachmentHandle RenderPassState::SubpassAttachmentHandle::AddInputAttachment(
    const char *attachment_str, VkImageLayout layout, const char *generator_subpass_str,
    VkPipelineStageFlags generator_stage, VkPipelineStageFlags use_stage, VkAccessFlags generator_access,
    VkAccessFlags use_access, VkDependencyFlags dependency_flag) {
	auto &info = m_state_ptr->m_subpass_infos[m_subpass];
	info.input_attachment_references.push_back({m_state_ptr->get_attachment(attachment_str), layout});

	auto &des = m_state_ptr->m_subpass_descriptions[m_subpass];
	des.pInputAttachments = info.input_attachment_references.data();
	des.inputAttachmentCount = info.input_attachment_references.size();

	m_state_ptr->insert_subpass_dependency(m_state_ptr->get_subpass(generator_subpass_str), m_subpass, generator_stage,
	                                       use_stage, generator_access, use_access, dependency_flag);
	return *this;
}